

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gga.c
# Opt level: O2

void xc_gga_exc_vxc_fxc(xc_func_type *p,size_t np,double *rho,double *sigma,double *zk,double *vrho,
                       double *vsigma,double *v2rho2,double *v2rhosigma,double *v2sigma2)

{
  xc_gga_out_params local_78;
  
  local_78.v4rho2sigma2 = (double *)0x0;
  local_78.v4rhosigma3 = (double *)0x0;
  local_78.v4rho4 = (double *)0x0;
  local_78.v4rho3sigma = (double *)0x0;
  local_78.v3rhosigma2 = (double *)0x0;
  local_78.v3sigma3 = (double *)0x0;
  local_78.v3rho3 = (double *)0x0;
  local_78.v3rho2sigma = (double *)0x0;
  local_78.v4sigma4 = (double *)0x0;
  local_78.vsigma = vsigma;
  local_78.v2rho2 = v2rho2;
  local_78.v2rhosigma = v2rhosigma;
  local_78.v2sigma2 = v2sigma2;
  local_78.zk = zk;
  local_78.vrho = vrho;
  xc_gga_new(p,2,np,rho,sigma,&local_78);
  return;
}

Assistant:

void
xc_gga_exc_vxc_fxc (const xc_func_type *p, size_t np, const double *rho, const double *sigma,
                    double *zk, double *vrho, double *vsigma,
                    double *v2rho2, double *v2rhosigma, double *v2sigma2)
{
  xc_gga_out_params out;
  libxc_memset(&out, 0, sizeof(xc_gga_out_params));
  out.zk     = zk;
  out.vrho   = vrho; out.vsigma = vsigma;
  out.v2rho2 = v2rho2; out.v2rhosigma = v2rhosigma; out.v2sigma2 = v2sigma2;
  
  xc_gga_new(p, 2, np, rho, sigma, &out);
}